

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O2

Property * __thiscall
Rml::ElementAnimation::UpdateAndGetProperty
          (Property *__return_storage_ptr__,ElementAnimation *this,double world_time,
          Element *element)

{
  int iVar1;
  float fVar2;
  int iVar3;
  pointer pAVar4;
  float fVar5;
  int key1;
  int key0;
  
  if ((((ulong)(((long)(this->keys).
                       super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->keys).
                      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x68) < 2) ||
      (this->animation_complete != false)) ||
     (fVar5 = (float)(world_time - this->last_update_world_time), fVar5 <= 0.0)) {
    Property::Property(__return_storage_ptr__);
  }
  else {
    if (0.1 <= fVar5) {
      fVar5 = 0.1;
    }
    this->last_update_world_time = world_time;
    fVar5 = fVar5 + this->time_since_iteration_start;
    this->time_since_iteration_start = fVar5;
    fVar2 = this->duration;
    if (fVar2 <= fVar5) {
      iVar3 = this->current_iteration;
      iVar1 = iVar3 + 1;
      this->current_iteration = iVar1;
      if ((this->num_iterations == -1) || (iVar1 < this->num_iterations && -2 < iVar3)) {
        this->time_since_iteration_start = fVar5 - fVar2;
        if (this->alternate_direction == true) {
          this->reverse_direction = (bool)(this->reverse_direction ^ 1);
        }
      }
      else {
        this->animation_complete = true;
        this->time_since_iteration_start = fVar2;
      }
    }
    key0 = -1;
    key1 = -1;
    fVar5 = GetInterpolationFactorAndKeys(this,&key0,&key1);
    pAVar4 = (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
             _M_impl.super__Vector_impl_data._M_start;
    InterpolateProperties
              (__return_storage_ptr__,&pAVar4[key0].property,&pAVar4[key1].property,fVar5,element,
               (pAVar4->property).definition);
  }
  return __return_storage_ptr__;
}

Assistant:

Property ElementAnimation::UpdateAndGetProperty(double world_time, Element& element)
{
	float dt = float(world_time - last_update_world_time);
	if (keys.size() < 2 || animation_complete || dt <= 0.0f)
		return Property{};

	dt = Math::Min(dt, 0.1f);

	last_update_world_time = world_time;
	time_since_iteration_start += dt;

	if (time_since_iteration_start >= duration)
	{
		// Next iteration
		current_iteration += 1;

		if (num_iterations == -1 || (current_iteration >= 0 && current_iteration < num_iterations))
		{
			time_since_iteration_start -= duration;

			if (alternate_direction)
				reverse_direction = !reverse_direction;
		}
		else
		{
			animation_complete = true;
			time_since_iteration_start = duration;
		}
	}

	int key0 = -1;
	int key1 = -1;

	float alpha = GetInterpolationFactorAndKeys(&key0, &key1);

	Property result = InterpolateProperties(keys[key0].property, keys[key1].property, alpha, element, keys[0].property.definition);

	return result;
}